

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::OneofFieldsArrayName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          Descriptor *desc)

{
  bool bVar1;
  string local_40;
  
  bVar1 = anon_unknown_0::HasOneofFields((Descriptor *)options);
  if (bVar1) {
    GetMessagePath_abi_cxx11_(&local_40,this,options,desc);
    std::operator+(__return_storage_ptr__,&local_40,".oneofGroups_");
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"null",(allocator *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

string OneofFieldsArrayName(const GeneratorOptions& options,
                            const Descriptor* desc) {
  return HasOneofFields(desc)
             ? (GetMessagePath(options, desc) + kOneofGroupArrayName)
             : "null";
}